

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O2

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::~sc_signal_t
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this,void **vtt)

{
  sc_process_handle::~sc_process_handle
            (&(this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)0>).
              super_sc_writer_policy_check_write.m_writer_p);
  sc_signal_channel::~sc_signal_channel(&this->super_sc_signal_channel);
  return;
}

Assistant:

virtual ~sc_signal_t() {}